

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

void __thiscall duckdb_shell::ShellState::ResetOutput(ShellState *this)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  ShellState *in_RDI;
  char *zCmd;
  char *zXdgOpenCmd;
  string local_38 [32];
  char *local_18;
  char *local_10;
  
  uVar2 = std::__cxx11::string::size();
  if ((uVar2 < 2) ||
     (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&in_RDI->outfile), *pcVar3 != '|')) {
    output_file_close((FILE *)0x1dc913);
    if (in_RDI->doXdgOpen != '\0') {
      local_10 = "xdg-open";
      local_18 = duckdb_shell_sqlite3_mprintf("%s %s","xdg-open",in_RDI->zTempFile);
      iVar1 = system(local_18);
      if (iVar1 == 0) {
        duckdb_shell_sqlite3_sleep((int)((ulong)in_RDI >> 0x20));
      }
      else {
        fprintf(_stderr,"Failed: [%s]\n",local_18);
      }
      duckdb_shell_sqlite3_free((void *)0x1dc991);
      PopOutputMode(in_RDI);
      in_RDI->doXdgOpen = '\0';
    }
  }
  else {
    pclose((FILE *)in_RDI->out);
  }
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::operator=((string *)&in_RDI->outfile,local_38);
  std::__cxx11::string::~string(local_38);
  in_RDI->out = _stdout;
  stdout_is_console = true;
  return;
}

Assistant:

void ShellState::ResetOutput() {
	if (outfile.size() > 1 && outfile[0] == '|') {
#ifndef SQLITE_OMIT_POPEN
		pclose(out);
#endif
	} else {
		output_file_close(out);
#ifndef SQLITE_NOHAVE_SYSTEM
		if (doXdgOpen) {
			const char *zXdgOpenCmd =
#if defined(_WIN32)
			    "start";
#elif defined(__APPLE__)
			    "open";
#else
			    "xdg-open";
#endif
			char *zCmd;
			zCmd = sqlite3_mprintf("%s %s", zXdgOpenCmd, zTempFile);
			if (system(zCmd)) {
				utf8_printf(stderr, "Failed: [%s]\n", zCmd);
			} else {
				/* Give the start/open/xdg-open command some time to get
				** going before we continue, and potential delete the
				** zTempFile data file out from under it */
				sqlite3_sleep(2000);
			}
			sqlite3_free(zCmd);
			PopOutputMode();
			doXdgOpen = 0;
		}
#endif /* !defined(SQLITE_NOHAVE_SYSTEM) */
	}
	outfile = string();
	out = stdout;
	stdout_is_console = true;
}